

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall Chainstate::CheckForkWarningConditions(Chainstate *this)

{
  CBlockIndex *pCVar1;
  CBlockIndex *block;
  Notifications *pNVar2;
  bool bVar3;
  ChainstateRole CVar4;
  ChainstateManager *pCVar5;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  bilingual_str local_b0;
  base_uint<256U> local_70;
  base_uint<256U> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
  if (!bVar3) {
    CVar4 = GetRole(this);
    if (CVar4 != BACKGROUND) {
      pCVar5 = this->m_chainman;
      pCVar1 = pCVar5->m_best_invalid;
      if (pCVar1 != (CBlockIndex *)0x0) {
        block = (this->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
        GetBlockProof((arith_uint256 *)&local_70,block);
        ::operator*(&local_50,&local_70,6);
        ::operator+((base_uint<256U> *)&local_b0,&(block->nChainWork).super_base_uint<256U>,
                    &local_50);
        bVar3 = operator>(&(pCVar1->nChainWork).super_base_uint<256U>,(base_uint<256U> *)&local_b0);
        if (bVar3) {
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file._M_len = 0x5e;
          logging_function._M_str = "CheckForkWarningConditions";
          logging_function._M_len = 0x1a;
          LogPrintFormatInternal<char[27]>
                    (logging_function,source_file,0x7ed,ALL,Info,(ConstevalFormatString<1U>)0xcd0f53
                     ,(char (*) [27])"CheckForkWarningConditions");
          pNVar2 = (this->m_chainman->m_options).notifications;
          _(&local_b0,(ConstevalStringLiteral)0xcd0fcc);
          (*pNVar2->_vptr_Notifications[5])(pNVar2,1,&local_b0);
          bilingual_str::~bilingual_str(&local_b0);
          goto LAB_008aeb73;
        }
        pCVar5 = this->m_chainman;
      }
      pNVar2 = (pCVar5->m_options).notifications;
      (*pNVar2->_vptr_Notifications[6])(pNVar2,1);
    }
  }
LAB_008aeb73:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::CheckForkWarningConditions()
{
    AssertLockHeld(cs_main);

    // Before we get past initial download, we cannot reliably alert about forks
    // (we assume we don't get stuck on a fork before finishing our initial sync)
    // Also not applicable to the background chainstate
    if (m_chainman.IsInitialBlockDownload() || this->GetRole() == ChainstateRole::BACKGROUND) {
        return;
    }

    if (m_chainman.m_best_invalid && m_chainman.m_best_invalid->nChainWork > m_chain.Tip()->nChainWork + (GetBlockProof(*m_chain.Tip()) * 6)) {
        LogPrintf("%s: Warning: Found invalid chain at least ~6 blocks longer than our best chain.\nChain state database corruption likely.\n", __func__);
        m_chainman.GetNotifications().warningSet(
            kernel::Warning::LARGE_WORK_INVALID_CHAIN,
            _("Warning: We do not appear to fully agree with our peers! You may need to upgrade, or other nodes may need to upgrade."));
    } else {
        m_chainman.GetNotifications().warningUnset(kernel::Warning::LARGE_WORK_INVALID_CHAIN);
    }
}